

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O1

void __thiscall google::protobuf::Enum::InternalSwap(Enum *this,Enum *other)

{
  InternalMetadata *this_00;
  ArenaStringPtr *this_01;
  ArenaStringPtr *this_02;
  int iVar1;
  string *psVar2;
  SourceContext *pSVar3;
  UnknownFieldSet *other_00;
  Arena *arena;
  
  this_00 = &(other->super_Message).super_MessageLite._internal_metadata_;
  if ((((ulong)(this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) != 0) ||
     (((ulong)this_00->ptr_ & 1) != 0)) {
    if (((ulong)this_00->ptr_ & 1) == 0) {
      other_00 = internal::InternalMetadata::
                 mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
    }
    else {
      other_00 = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
    }
    internal::InternalMetadata::DoSwap<google::protobuf::UnknownFieldSet>
              (&(this->super_Message).super_MessageLite._internal_metadata_,other_00);
  }
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->enumvalue_).super_RepeatedPtrFieldBase,
             &(other->enumvalue_).super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->options_).super_RepeatedPtrFieldBase,
             &(other->options_).super_RepeatedPtrFieldBase);
  this_01 = &this->name_;
  arena = (Arena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  this_02 = &other->name_;
  if (this_01->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    if (this_02->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_)
    goto LAB_0030592f;
    internal::ArenaStringPtr::CreateInstance
              (this_01,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  }
  psVar2 = this_01->ptr_;
  if (this_02->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstance
              (this_02,arena,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
  }
  std::__cxx11::string::swap((string *)psVar2);
LAB_0030592f:
  pSVar3 = this->source_context_;
  this->source_context_ = other->source_context_;
  other->source_context_ = pSVar3;
  iVar1 = this->syntax_;
  this->syntax_ = other->syntax_;
  other->syntax_ = iVar1;
  return;
}

Assistant:

void Enum::InternalSwap(Enum* other) {
  using std::swap;
  _internal_metadata_.Swap<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(&other->_internal_metadata_);
  enumvalue_.InternalSwap(&other->enumvalue_);
  options_.InternalSwap(&other->options_);
  name_.Swap(&other->name_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), GetArena());
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(Enum, syntax_)
      + sizeof(Enum::syntax_)
      - PROTOBUF_FIELD_OFFSET(Enum, source_context_)>(
          reinterpret_cast<char*>(&source_context_),
          reinterpret_cast<char*>(&other->source_context_));
}